

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaG_errormsg(lua_State *L)

{
  long lVar1;
  StkId pTVar2;
  StkId pTVar3;
  int iVar4;
  CallInfo *pCVar5;
  
  lVar1 = L->errfunc;
  if (lVar1 != 0) {
    pTVar2 = L->stack;
    if (*(int *)((long)&pTVar2->tt + lVar1) != 6) goto LAB_00104ae3;
    pTVar3 = L->top;
    pTVar3->value = pTVar3[-1].value;
    pTVar3->tt = pTVar3[-1].tt;
    pTVar3 = L->top;
    pTVar3[-1].value = *(Value *)((long)&pTVar2->value + lVar1);
    pTVar3[-1].tt = *(int *)((long)&pTVar2->tt + lVar1);
    if ((long)L->stack_last - (long)L->top < 0x11) {
      luaD_growstack(L,1);
    }
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    luaD_call(L,pTVar2 + -1,1);
  }
  luaD_throw(L,2);
LAB_00104ae3:
  pCVar5 = (CallInfo *)0x5;
  luaD_throw(L,5);
  pTVar2 = pCVar5->func;
  iVar4 = -1;
  if ((pTVar2->tt == 6) && (iVar4 = -1, (((pTVar2->value).gc)->h).flags == '\0')) {
    if (L->ci == pCVar5) {
      pCVar5->savedpc = L->savedpc;
    }
    iVar4 = (int)((ulong)((long)pCVar5->savedpc - (long)((((pTVar2->value).gc)->th).l_G)->ud) >> 2)
            + -1;
  }
  if ((-1 < iVar4) && (((((pTVar2->value).gc)->th).l_G)->rootgc == (GCObject *)0x0)) {
    return;
  }
  return;
}

Assistant:

static void luaG_errormsg(lua_State*L){
if(L->errfunc!=0){
StkId errfunc=restorestack(L,L->errfunc);
if(!ttisfunction(errfunc))luaD_throw(L,5);
setobj(L,L->top,L->top-1);
setobj(L,L->top-1,errfunc);
incr_top(L);
luaD_call(L,L->top-2,1);
}
luaD_throw(L,2);
}